

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

common_chat_params *
common_chat_templates_apply_jinja(common_chat_templates *tmpls,common_chat_templates_inputs *inputs)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  string *psVar4;
  chat_template_caps *pcVar5;
  ulong uVar6;
  chat_template_caps *pcVar7;
  common_log *log;
  runtime_error *this;
  long lVar8;
  common_chat_template *in_RDX;
  common_chat_params *in_RDI;
  templates_params *in_stack_00000040;
  common_chat_template *in_stack_00000048;
  bool allow_python_tag_builtin_tools;
  chat_template_caps *caps;
  string *src;
  chat_template *tmpl;
  templates_params params;
  bool in_stack_0000018f;
  templates_params *in_stack_00000190;
  common_chat_template *in_stack_00000198;
  templates_params *in_stack_00000200;
  common_chat_template *in_stack_00000208;
  templates_params *in_stack_00000220;
  common_chat_template *in_stack_00000228;
  vector<common_chat_tool,_std::allocator<common_chat_tool>_> *in_stack_00000318;
  undefined1 in_stack_00000697;
  vector<common_chat_msg,_std::allocator<common_chat_msg>_> *in_stack_00000698;
  templates_params *in_stack_000013e0;
  common_chat_template *in_stack_000013e8;
  nullptr_t in_stack_fffffffffffffe78;
  common_log *in_stack_fffffffffffffe80;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffe88;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffe90;
  chat_template *local_120;
  templates_params *in_stack_ffffffffffffff20;
  common_chat_template *in_stack_ffffffffffffff28;
  templates_params *in_stack_ffffffffffffff60;
  common_chat_template *in_stack_ffffffffffffff68;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  bStack_70;
  int local_60;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  json_value in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8;
  byte bVar9;
  undefined7 in_stack_ffffffffffffffb9;
  string local_40 [32];
  undefined6 in_stack_ffffffffffffffe2;
  
  templates_params::templates_params((templates_params *)in_stack_fffffffffffffe80);
  common_chat_tools_to_json_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            (in_stack_00000318);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffe80);
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::is_array(&bStack_70);
  if ((bVar1) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>
                          *)0x2a2ad5), bVar1)) {
    local_120 = std::unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>::
                operator*((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>
                           *)in_stack_fffffffffffffe80);
  }
  else {
    local_120 = std::unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>::
                operator*((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>
                           *)in_stack_fffffffffffffe80);
  }
  psVar4 = minja::chat_template::source_abi_cxx11_(local_120);
  pcVar5 = minja::chat_template::original_caps(local_120);
  minja::chat_template::original_caps(local_120);
  common_chat_msgs_to_json_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            (in_stack_00000698,(bool)in_stack_00000697);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffe80);
  bVar2 = (byte)(in_RDX->eos_token_)._M_string_length & 1;
  bVar3 = *(byte *)((long)&(in_RDX->template_root_).
                           super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 5) & 1;
  local_60 = *(int *)&(in_RDX->template_root_).
                      super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
  std::__cxx11::string::operator=(local_40,(string *)&(in_RDX->source_)._M_string_length);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
    ::function((function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8),
               (parser_callback_t *)in_stack_ffffffffffffffb0.object,(bool)in_stack_ffffffffffffffaf
               ,(bool)in_stack_ffffffffffffffae);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffe80);
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
    ::~function((function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                 *)0x2a2cbe);
  }
  if ((((ulong)(in_RDX->template_root_).
               super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       & 0x100000000) == 0) ||
     (pcVar7 = minja::chat_template::original_caps(local_120),
     (pcVar7->supports_parallel_tool_calls & 1U) != 0)) {
    bVar9 = *(byte *)((long)&(in_RDX->template_root_).
                             super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4) & 1;
  }
  else {
    if (0 < common_log_verbosity_thold) {
      log = common_log_main();
      common_log_add(log,GGML_LOG_LEVEL_DEBUG,
                     "Disabling parallel_tool_calls because the template does not support it\n");
    }
    bVar9 = 0;
  }
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::is_array(&bStack_70);
  if (bVar1) {
    if ((local_60 != 2) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Cannot specify grammar with tools");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((((pcVar5->supports_tool_calls & 1U) != 0) && ((pcVar5->supports_tools & 1U) == 0)) &&
       (-1 < common_log_verbosity_thold)) {
      in_stack_fffffffffffffe80 = common_log_main();
      common_log_add(in_stack_fffffffffffffe80,GGML_LOG_LEVEL_WARN,
                     "Template supports tool calls but does not natively describe tools. The fallback behaviour used may produce bad results, inspect prompt w/ --verbose & consider overriding the template.\n"
                    );
    }
  }
  lVar8 = std::__cxx11::string::find((char *)psVar4,0x3d304d);
  if ((lVar8 == -1) ||
     (bVar1 = nlohmann::json_abi_v3_11_3::
              basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::is_null((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)&stack0xffffffffffffffa8), !bVar1)) {
    lVar8 = std::__cxx11::string::find((char *)psVar4,0x3d306a);
    if ((lVar8 == -1) ||
       (bVar1 = nlohmann::json_abi_v3_11_3::
                basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::is_null((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)&stack0xffffffffffffffa8), !bVar1)) {
      lVar8 = std::__cxx11::string::find((char *)psVar4,0x3d308b);
      if ((((lVar8 == -1) ||
           (bVar1 = nlohmann::json_abi_v3_11_3::
                    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::is_null((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&stack0xffffffffffffffa8), !bVar1)) ||
          (bVar1 = nlohmann::json_abi_v3_11_3::
                   basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::is_array(&bStack_70), !bVar1)) ||
         (bVar1 = nlohmann::json_abi_v3_11_3::
                  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::is_null((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)&stack0xffffffffffffffa8), !bVar1)) {
        bVar1 = nlohmann::json_abi_v3_11_3::
                basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::is_array(&bStack_70);
        if ((bVar1) &&
           (bVar1 = nlohmann::json_abi_v3_11_3::
                    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::is_object((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)&stack0xffffffffffffffa8), bVar1)) {
          common_chat_params_init_generic(in_stack_000013e8,in_stack_000013e0);
        }
        else {
          lVar8 = std::__cxx11::string::find((char *)psVar4,0x3d3097);
          if (lVar8 == -1) {
            lVar8 = std::__cxx11::string::find((char *)psVar4,0x3d309e);
            if (lVar8 == -1) {
              bVar1 = nlohmann::json_abi_v3_11_3::
                      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::is_null(&bStack_70);
              if ((bVar1) ||
                 (*(int *)&(in_RDX->template_root_).
                           super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi == 2)) {
                common_chat_params_init_without_tools
                          (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
              }
              else {
                lVar8 = std::__cxx11::string::find((char *)psVar4,0x3d30aa);
                if ((lVar8 == -1) ||
                   (lVar8 = std::__cxx11::string::find((char *)psVar4,0x3d4120), lVar8 == -1)) {
                  lVar8 = std::__cxx11::string::find((char *)psVar4,0x3d30be);
                  if (lVar8 == -1) {
                    lVar8 = std::__cxx11::string::find((char *)psVar4,0x3d30ea);
                    if (lVar8 == -1) {
                      common_chat_params_init_generic(in_stack_000013e8,in_stack_000013e0);
                    }
                    else {
                      common_chat_params_init_mistral_nemo(in_stack_00000048,in_stack_00000040);
                    }
                  }
                  else {
                    std::__cxx11::string::find((char *)psVar4,0x3d4286);
                    common_chat_params_init_llama_3_1_tool_calls
                              (in_stack_00000198,in_stack_00000190,in_stack_0000018f);
                  }
                }
                else {
                  common_chat_params_init_functionary_v3_1_llama_3_1
                            ((common_chat_template *)CONCAT71(in_stack_ffffffffffffffb9,bVar9),
                             (templates_params *)in_stack_ffffffffffffffb0.object);
                }
              }
            }
            else {
              common_chat_params_init_firefunction_v2(in_stack_00000228,in_stack_00000220);
            }
          }
          else {
            common_chat_params_init_functionary_v3_2
                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          }
        }
      }
      else {
        common_chat_params_init_hermes_2_pro(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      }
    }
    else {
      common_chat_params_init_command_r7b(in_stack_00000208,in_stack_00000200);
    }
  }
  else {
    common_chat_params_init_deepseek_r1
              (in_RDX,(templates_params *)CONCAT62(in_stack_ffffffffffffffe2,CONCAT11(bVar3,bVar2)))
    ;
  }
  templates_params::~templates_params((templates_params *)in_stack_fffffffffffffe80);
  return in_RDI;
}

Assistant:

static common_chat_params common_chat_templates_apply_jinja(
    const struct common_chat_templates * tmpls,
    const struct common_chat_templates_inputs & inputs)
{
    templates_params params;
    params.tools = common_chat_tools_to_json_oaicompat<json>(inputs.tools);
    const auto & tmpl = params.tools.is_array() && tmpls->template_tool_use
        ? *tmpls->template_tool_use
        : *tmpls->template_default;
    const auto & src = tmpl.source();
    const auto & caps = tmpl.original_caps();
    params.messages = common_chat_msgs_to_json_oaicompat<json>(inputs.messages, /* concat_text= */ !tmpl.original_caps().requires_typed_content);
    params.add_generation_prompt = inputs.add_generation_prompt;
    params.extract_reasoning = inputs.extract_reasoning;
    params.tool_choice = inputs.tool_choice;
    params.grammar = inputs.grammar;
    if (!inputs.json_schema.empty()) {
        params.json_schema = json::parse(inputs.json_schema);
    }

    if (inputs.parallel_tool_calls && !tmpl.original_caps().supports_parallel_tool_calls) {
        LOG_DBG("Disabling parallel_tool_calls because the template does not support it\n");
        params.parallel_tool_calls = false;
    } else {
        params.parallel_tool_calls = inputs.parallel_tool_calls;
    }

    if (params.tools.is_array()) {
        if (params.tool_choice != COMMON_CHAT_TOOL_CHOICE_NONE && !params.grammar.empty()) {
            throw std::runtime_error("Cannot specify grammar with tools");
        }
        if (caps.supports_tool_calls && !caps.supports_tools) {
            LOG_WRN("Template supports tool calls but does not natively describe tools. The fallback behaviour used may produce bad results, inspect prompt w/ --verbose & consider overriding the template.\n");
        }
    }

    // DeepSeek R1: use handler in all cases except json schema (thinking / tools).
    if (src.find("<｜tool▁calls▁begin｜>") != std::string::npos && params.json_schema.is_null()) {
        return common_chat_params_init_deepseek_r1(tmpl, params);
    }

    // Command R7B: : use handler in all cases except json schema (thinking / tools).
    if (src.find("<|END_THINKING|><|START_ACTION|>") != std::string::npos && params.json_schema.is_null()) {
        return common_chat_params_init_command_r7b(tmpl, params);
    }

    // Hermes 2/3 Pro, Qwen 2.5 Instruct (w/ tools)
    if (src.find("<tool_call>") != std::string::npos && params.json_schema.is_null() && params.tools.is_array() && params.json_schema.is_null()) {
        return common_chat_params_init_hermes_2_pro(tmpl, params);
    }

    // Use generic handler when mixing tools + JSON schema.
    // TODO: support that mix in handlers below.
    if ((params.tools.is_array() && params.json_schema.is_object())) {
        return common_chat_params_init_generic(tmpl, params);
    }

    // Functionary prepends "all\n" to plain content outputs, so we use its handler in all cases.
    if (src.find(">>>all") != std::string::npos) {
        return common_chat_params_init_functionary_v3_2(tmpl, params);
    }

    // Firefunction v2 requires datetime and functions in the context even w/o tools, so we also use its handler in all cases.
    if (src.find(" functools[") != std::string::npos) {
        return common_chat_params_init_firefunction_v2(tmpl, params);
    }

    // Plain handler (no tools)
    if (params.tools.is_null() || inputs.tool_choice == COMMON_CHAT_TOOL_CHOICE_NONE) {
        return common_chat_params_init_without_tools(tmpl, params);
    }

    // Functionary v3.1 (w/ tools)
    if (src.find("<|start_header_id|>") != std::string::npos
        && src.find("<function=") != std::string::npos) {
        return common_chat_params_init_functionary_v3_1_llama_3_1(tmpl, params);
    }

    // Llama 3.1, 3.2, 3.3 (w/ tools)
    if (src.find("<|start_header_id|>ipython<|end_header_id|>") != std::string::npos) {
        auto allow_python_tag_builtin_tools = src.find("<|python_tag|>") != std::string::npos;
        return common_chat_params_init_llama_3_1_tool_calls(tmpl, params, allow_python_tag_builtin_tools);
    }

    // Mistral Nemo (w/ tools)
    if (src.find("[TOOL_CALLS]") != std::string::npos) {
        return common_chat_params_init_mistral_nemo(tmpl, params);
    }

    // Generic fallback
    return common_chat_params_init_generic(tmpl, params);
}